

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMulti.c
# Opt level: O0

void Lpk_CreateVarOrder(Kit_DsdNtk_t *pNtk,char (*pTable) [16])

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_c0;
  int local_bc;
  int y;
  int x;
  int i;
  int iFaninLit;
  int nBelow;
  int nAbove;
  int Below [16];
  int Above [16];
  uint k;
  uint uSuppFanins;
  Kit_DsdObj_t *pObj;
  char (*pTable_local) [16];
  Kit_DsdNtk_t *pNtk_local;
  
  y = 0;
  while( true ) {
    bVar3 = false;
    if (y < (int)(uint)pNtk->nNodes) {
      _k = pNtk->pNodes[y];
      bVar3 = _k != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar3) break;
    iFaninLit = 0;
    Above[0xf] = 0;
    for (Above[0xe] = 0; (uint)Above[0xe] < (uint)*_k >> 0x1a; Above[0xe] = Above[0xe] + 1) {
      uVar2 = (uint)*(ushort *)((long)&_k[1].field_0x0 + (ulong)(uint)Above[0xe] * 2);
      iVar1 = Kit_DsdLitIsLeaf(pNtk,uVar2);
      if (iVar1 == 0) {
        uVar2 = Kit_DsdLitSupport(pNtk,uVar2);
        Above[0xf] = uVar2 | Above[0xf];
      }
      else {
        iVar1 = Abc_Lit2Var(uVar2);
        Below[(long)iFaninLit + 0xe] = iVar1;
        iFaninLit = iFaninLit + 1;
      }
    }
    i = 0;
    for (local_c0 = 0; local_c0 < 0x10; local_c0 = local_c0 + 1) {
      if ((Above[0xf] & 1 << ((byte)local_c0 & 0x1f)) != 0) {
        (&nBelow)[i] = local_c0;
        i = i + 1;
      }
    }
    for (local_bc = 0; local_bc < iFaninLit; local_bc = local_bc + 1) {
      for (local_c0 = 0; local_c0 < i; local_c0 = local_c0 + 1) {
        pTable[Below[(long)local_bc + 0xe]][(&nBelow)[local_c0]] =
             pTable[Below[(long)local_bc + 0xe]][(&nBelow)[local_c0]] + '\x01';
      }
    }
    y = y + 1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Records variable order.]

  Description [Increaments Order[x][y] by 1 if x should be above y in the DSD.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Lpk_CreateVarOrder( Kit_DsdNtk_t * pNtk, char pTable[][16] )
{
    Kit_DsdObj_t * pObj;
    unsigned uSuppFanins, k;
    int Above[16], Below[16];
    int nAbove, nBelow, iFaninLit, i, x, y;
    // iterate through the nodes
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        // collect fanin support of this node
        nAbove = 0;
        uSuppFanins = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iFaninLit, k )
        {
            if ( Kit_DsdLitIsLeaf( pNtk, iFaninLit ) )
                Above[nAbove++] = Abc_Lit2Var(iFaninLit);
            else
                uSuppFanins |= Kit_DsdLitSupport( pNtk, iFaninLit );
        }
        // find the below variables
        nBelow = 0;
        for ( y = 0; y < 16; y++ )
            if ( uSuppFanins & (1 << y) )
                Below[nBelow++] = y;
        // create all pairs
        for ( x = 0; x < nAbove; x++ )
            for ( y = 0; y < nBelow; y++ )
                pTable[Above[x]][Below[y]]++;
    }
}